

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O3

void __thiscall Palette::readSettings(Palette *this,QSettings *settings)

{
  undefined8 uVar1;
  long lVar2;
  QString colorstr;
  QColor color;
  QArrayData *local_90;
  long local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_50;
  
  QSettings::beginGroup((QString *)settings);
  lVar2 = 0;
  do {
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    local_60 = 2;
    QSettings::value((QString *)&local_50,(QVariant *)settings);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&local_50);
    QVariant::~QVariant((QVariant *)&local_78);
    if (local_80 == 0) {
LAB_00141664:
      uVar1 = *(undefined8 *)((long)&DAT_001b3200 + lVar2);
      *(undefined8 *)((long)&(this->mData)._M_elems[0].cspec + lVar2) =
           *(undefined8 *)((long)&PaletteTU::ColorDefaults + lVar2);
      *(int *)((long)&(this->mData)._M_elems[0].ct + lVar2 + 4) = (int)uVar1;
      *(short *)((long)&(this->mData)._M_elems[0].ct + lVar2 + 8) = (short)((ulong)uVar1 >> 0x20);
    }
    else {
      QColor::setNamedColor((QString *)&local_50);
      if (local_50._0_4_ == 0) goto LAB_00141664;
      QColor::setAlpha((int)&local_50);
      *(ulong *)((long)&(this->mData)._M_elems[0].ct + lVar2 + 2) =
           CONCAT62(local_50._8_6_,local_50._6_2_);
      *(ulong *)((long)&(this->mData)._M_elems[0].cspec + lVar2) =
           CONCAT26(local_50._6_2_,CONCAT24(local_50._4_2_,local_50._0_4_));
    }
    if (local_90 != (QArrayData *)0x0) {
      LOCK();
      (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_90,2,8);
      }
    }
    lVar2 = lVar2 + 0x10;
    if (lVar2 == 0x1a0) {
      QSettings::endGroup();
      return;
    }
  } while( true );
}

Assistant:

void Palette::readSettings(QSettings &settings) {

    settings.beginGroup(Keys::Palette);

    for (int i = 0; i < ColorCount; ++i) {

        auto colorstr = settings.value(TU::ColorKeys[i]).toString();
        if (!colorstr.isEmpty()) {
            QColor color(colorstr);
            if (color.isValid()) {
                color.setAlpha(255); // sanitize
                mData[i] = color;
                continue; // success, do not load default
            }
        }
        // setting not found or was invalid
        // load the default
        mData[i] = getDefault((Color)i);
    }

    settings.endGroup();
}